

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O2

void __thiscall
dtc::fdt::checking::check_manager::add_property_size_checker
          (check_manager *this,char *name,string *prop,uint32_t size)

{
  property_size_checker *this_00;
  allocator<char> local_71;
  uint *local_70;
  undefined8 local_68;
  uint local_60 [2];
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint *local_50;
  undefined8 local_48;
  uint local_40 [2];
  undefined4 uStack_38;
  undefined4 uStack_34;
  property_size_checker *local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_71);
  this_00 = (property_size_checker *)operator_new(0x50);
  property_size_checker::property_size_checker(this_00,name,prop,size);
  local_48 = local_68;
  local_50 = local_40;
  if (local_70 == local_60) {
    uStack_38 = uStack_58;
    uStack_34 = uStack_54;
  }
  else {
    local_50 = local_70;
  }
  local_68 = 0;
  local_60[0] = local_60[0] & 0xffffff00;
  local_70 = local_60;
  local_30 = this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,dtc::fdt::checking::property_size_checker*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void
check_manager::add_property_size_checker(const char *name,
                                         const string &prop,
                                         uint32_t size)
{
	checkers.insert(std::make_pair(string(name),
		new property_size_checker(name, prop, size)));
}